

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  Curl_easy *data_00;
  long lVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  _Bool _Var7;
  uint uVar8;
  uint uVar9;
  CURLcode CVar10;
  timediff_t tVar11;
  timediff_t tVar12;
  int *piVar13;
  char *pcVar14;
  curltime newer;
  curltime older;
  curltime older_00;
  curltime cVar15;
  timediff_t local_2e0;
  char local_2b8 [8];
  char buffer_1 [256];
  char *local_1b0;
  char *hostname;
  char buffer [256];
  char ipaddress [46];
  CURLcode status;
  int other;
  uint local_60;
  int i;
  int rc;
  curltime now;
  int error;
  timediff_t allow;
  CURLcode result;
  Curl_easy *data;
  _Bool *connected_local;
  int sockindex_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  allow._4_4_ = CURLE_OK;
  now._12_4_ = 0;
  *connected = false;
  if (((conn->bits).tcpconnect[sockindex] & 1U) == 0) {
    cVar15 = Curl_now();
    _i = cVar15.tv_sec;
    now.tv_sec._0_4_ = cVar15.tv_usec;
    tVar11 = Curl_timeleft(data_00,(curltime *)&i,true);
    if (tVar11 < 0) {
      Curl_failf(data_00,"Connection time-out");
      conn_local._4_4_ = CURLE_OPERATION_TIMEDOUT;
    }
    else if (((conn->cnnct).state == CONNECT_INIT) || (CONNECT_REQ_READ_MORE < (conn->cnnct).state))
    {
      for (local_60 = 0; (int)local_60 < 2; local_60 = local_60 + 1) {
        uVar8 = local_60 ^ 1;
        if (conn->tempsock[(int)local_60] != -1) {
          uVar9 = Curl_socket_check(-1,-1,conn->tempsock[(int)local_60],0);
          if (uVar9 == 0) {
            now._12_4_ = 0;
            cVar15.tv_usec = (int)now.tv_sec;
            cVar15.tv_sec = _i;
            uVar2 = (conn->connecttime).tv_sec;
            uVar3 = (conn->connecttime).tv_usec;
            older.tv_usec = uVar3;
            older.tv_sec = uVar2;
            cVar15._12_4_ = 0;
            older._12_4_ = 0;
            tVar12 = Curl_timediff(cVar15,older);
            if (conn->timeoutms_per_addr <= tVar12) {
              Curl_infof(data_00,"After %ldms connect time, move on!\n",conn->timeoutms_per_addr);
              now._12_4_ = 0x6e;
            }
            if (((local_60 == 0) && (conn->tempaddr[1] == (Curl_addrinfo *)0x0)) &&
               (newer.tv_usec = (int)now.tv_sec, newer.tv_sec = _i,
               uVar4 = (conn->connecttime).tv_sec, uVar5 = (conn->connecttime).tv_usec,
               older_00.tv_usec = uVar5, older_00.tv_sec = uVar4, newer._12_4_ = 0,
               older_00._12_4_ = 0, tVar12 = Curl_timediff(newer,older_00),
               (data_00->set).happy_eyeballs_timeout <= tVar12)) {
              trynextip(conn,sockindex,1);
            }
          }
          else if ((uVar9 == 2) || ((*(uint *)&(conn->bits).field_0x4 >> 0x1b & 1) != 0)) {
            _Var7 = verifyconnect(conn->tempsock[(int)local_60],(int *)&now.field_0xc);
            if (_Var7) {
              conn->sock[sockindex] = conn->tempsock[(int)local_60];
              conn->ip_addr = conn->tempaddr[(int)local_60];
              conn->tempsock[(int)local_60] = -1;
              *(uint *)&(conn->bits).field_0x4 =
                   *(uint *)&(conn->bits).field_0x4 & 0xfffff7ff |
                   (uint)(conn->ip_addr->ai_family == 10) << 0xb;
              if (conn->tempsock[(int)uVar8] != -1) {
                Curl_closesocket(conn,conn->tempsock[(int)uVar8]);
                conn->tempsock[(int)uVar8] = -1;
              }
              CVar10 = connect_SOCKS(conn,sockindex,connected);
              if (CVar10 != CURLE_OK) {
                return CVar10;
              }
              if ((*connected & 1U) == 0) {
                return CURLE_OK;
              }
              post_SOCKS(conn,sockindex,connected);
              return CURLE_OK;
            }
            Curl_infof(data_00,"Connection failed\n");
          }
          else if ((uVar9 & 4) != 0) {
            verifyconnect(conn->tempsock[(int)local_60],(int *)&now.field_0xc);
          }
          uVar6 = now._12_4_;
          if (now._12_4_ != 0) {
            (data_00->state).os_errno = now._12_4_;
            piVar13 = __errno_location();
            *piVar13 = uVar6;
            if (conn->tempaddr[(int)local_60] != (Curl_addrinfo *)0x0) {
              Curl_printable_address(conn->tempaddr[(int)local_60],buffer + 0xf8,0x2e);
              lVar1 = conn->port;
              pcVar14 = Curl_strerror(now._12_4_,(char *)&hostname,0x100);
              Curl_infof(data_00,"connect to %s port %ld failed: %s\n",buffer + 0xf8,lVar1,pcVar14);
              local_2e0 = tVar11;
              if (conn->tempaddr[(int)local_60]->ai_next != (Curl_addrinfo *)0x0) {
                local_2e0 = tVar11 / 2;
              }
              conn->timeoutms_per_addr = local_2e0;
              CVar10 = trynextip(conn,sockindex,local_60);
              if ((CVar10 != CURLE_COULDNT_CONNECT) || (conn->tempsock[(int)uVar8] == -1)) {
                allow._4_4_ = CVar10;
              }
            }
          }
        }
      }
      if (allow._4_4_ != CURLE_OK) {
        if ((conn->tempaddr[1] == (Curl_addrinfo *)0x0) &&
           (allow._4_4_ = trynextip(conn,sockindex,1), allow._4_4_ == CURLE_OK)) {
          return CURLE_OK;
        }
        if ((*(uint *)&(conn->bits).field_0x4 >> 7 & 1) == 0) {
          if ((*(uint *)&(conn->bits).field_0x4 >> 6 & 1) == 0) {
            if ((*(uint *)&(conn->bits).field_0x4 >> 3 & 1) == 0) {
              local_1b0 = (conn->host).name;
            }
            else {
              local_1b0 = (conn->conn_to_host).name;
            }
          }
          else {
            local_1b0 = (conn->http_proxy).host.name;
          }
        }
        else {
          local_1b0 = (conn->socks_proxy).host.name;
        }
        lVar1 = conn->port;
        pcVar14 = Curl_strerror(now._12_4_,local_2b8,0x100);
        Curl_failf(data_00,"Failed to connect to %s port %ld: %s",local_1b0,lVar1,pcVar14);
        if ((data_00->state).os_errno == 0x6e) {
          allow._4_4_ = CURLE_OPERATION_TIMEDOUT;
        }
      }
      conn_local._4_4_ = allow._4_4_;
    }
    else {
      conn_local._4_4_ = connect_SOCKS(conn,sockindex,connected);
      if ((conn_local._4_4_ == CURLE_OK) && ((*connected & 1U) != 0)) {
        post_SOCKS(conn,sockindex,connected);
      }
    }
  }
  else {
    *connected = true;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  timediff_t allow;
  int error = 0;
  struct curltime now;
  int rc;
  int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_now();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(SOCKS_STATE(conn->cnnct.state)) {
    /* still doing SOCKS */
    result = connect_SOCKS(conn, sockindex, connected);
    if(!result && *connected)
      post_SOCKS(conn, sockindex, connected);
    return result;
  }

  for(i = 0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;

#ifdef ENABLE_QUIC
    if(conn->transport == TRNSPRT_QUIC) {
      result = Curl_quic_is_connected(conn, i, connected);
      if(result) {
        error = SOCKERRNO;
        goto error;
      }
      if(*connected) {
        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
        connkeep(conn, "HTTP/3 default");
      }
      return result;
    }
#endif

#ifdef mpeix
    /* Call this function once now, and ignore the results. We do this to
       "clear" the error state on the socket so that we can later read it
       reliably. This is reported necessary on the MPE/iX operating system. */
    (void)verifyconnect(conn->tempsock[i], NULL);
#endif

    /* check socket for connect */
    rc = SOCKET_WRITABLE(conn->tempsock[i], 0);

    if(rc == 0) { /* no connection yet */
      error = 0;
      if(Curl_timediff(now, conn->connecttime) >= conn->timeoutms_per_addr) {
        infof(data, "After %" CURL_FORMAT_TIMEDIFF_T
              "ms connect time, move on!\n", conn->timeoutms_per_addr);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && conn->tempaddr[1] == NULL &&
         (Curl_timediff(now, conn->connecttime) >=
          data->set.happy_eyeballs_timeout)) {
        trynextip(conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT || conn->bits.tcp_fastopen) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
        conn->bits.ipv6 = (conn->ip_addr->ai_family == AF_INET6)?TRUE:FALSE;
#endif

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to kick off any SOCKS proxy magic once we
           connected */
        result = connect_SOCKS(conn, sockindex, connected);
        if(result || !*connected)
          return result;

        post_SOCKS(conn, sockindex, connected);

        return CURLE_OK;
      }
      infof(data, "Connection failed\n");
    }
    else if(rc & CURL_CSELECT_ERR)
      (void)verifyconnect(conn->tempsock[i], &error);

#ifdef ENABLE_QUIC
    error:
#endif
    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
#ifndef CURL_DISABLE_VERBOSE_STRINGS
        char ipaddress[MAX_IPADR_LEN];
        char buffer[STRERROR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress, MAX_IPADR_LEN);
#endif
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port,
              Curl_strerror(error, buffer, sizeof(buffer)));

        conn->timeoutms_per_addr = conn->tempaddr[i]->ai_next == NULL ?
          allow : allow / 2;

        status = trynextip(conn, sockindex, i);
        if((status != CURLE_COULDNT_CONNECT) ||
           conn->tempsock[other] == CURL_SOCKET_BAD)
          /* the last attempt failed and no other sockets remain open */
          result = status;
      }
    }
  }

  if(result) {
    /* no more addresses to try */
    const char *hostname;
    char buffer[STRERROR_LEN];

    /* if the first address family runs out of addresses to try before
       the happy eyeball timeout, go ahead and try the next family now */
    if(conn->tempaddr[1] == NULL) {
      result = trynextip(conn, sockindex, 1);
      if(!result)
        return result;
    }

    if(conn->bits.socksproxy)
      hostname = conn->socks_proxy.host.name;
    else if(conn->bits.httpproxy)
      hostname = conn->http_proxy.host.name;
    else if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;

    failf(data, "Failed to connect to %s port %ld: %s",
          hostname, conn->port,
          Curl_strerror(error, buffer, sizeof(buffer)));

#ifdef WSAETIMEDOUT
    if(WSAETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#elif defined(ETIMEDOUT)
    if(ETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#endif
  }

  return result;
}